

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccmake.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char **argv_00;
  long lVar7;
  cmCursesMainForm *this;
  ostream *poVar8;
  long *plVar9;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 collapse;
  uint initWidth;
  ulong uVar10;
  ulong uVar11;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  CommandLineArguments encoding_args;
  cmDocumentation doc;
  string cacheDir;
  string local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  undefined1 local_3c8 [40];
  CommandLineArguments local_3a0;
  cmDocumentation local_388;
  undefined1 local_2e0 [688];
  
  cmsys::Encoding::CommandLineArguments::Main(&local_3a0,argc,argv);
  uVar5 = cmsys::Encoding::CommandLineArguments::argc(&local_3a0);
  argv_00 = cmsys::Encoding::CommandLineArguments::argv(&local_3a0);
  cmSystemTools::FindCMakeResources(*argv_00);
  cmDocumentation::cmDocumentation(&local_388);
  cmDocumentation::addCMakeStandardDocSections(&local_388);
  bVar4 = cmDocumentation::CheckOptions(&local_388,uVar5,argv_00,(char *)0x0);
  if (bVar4) {
    cmake::cmake((cmake *)local_2e0);
    paVar1 = &local_408.field_2;
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
    cmake::SetHomeDirectory((cmake *)local_2e0,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
    cmake::SetHomeOutputDirectory((cmake *)local_2e0,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    cmake::AddCMakePaths((cmake *)local_2e0);
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (pointer)0x0;
    local_3c8._16_8_ = (pointer)0x0;
    cmake::GetGeneratorDocumentation
              ((cmake *)local_2e0,
               (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_3c8);
    local_408._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"ccmake","");
    cmDocumentation::SetName(&local_388,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != paVar1) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    cmDocumentation::SetSection(&local_388,"Name",cmDocumentationName);
    cmDocumentation::SetSection(&local_388,"Usage",cmDocumentationUsage);
    if (uVar5 == 1) {
      cmDocumentation::AppendSection(&local_388,"Usage",cmDocumentationUsageNote);
    }
    cmDocumentation::SetSection
              (&local_388,"Generators",
               (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_3c8);
    cmDocumentation::PrependSection(&local_388,"Options",cmDocumentationOptions);
    bVar4 = cmDocumentation::PrintRequestedDocumentation(&local_388,(ostream *)&std::cout);
    uVar5 = (uint)!bVar4;
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_3c8);
    cmake::~cmake((cmake *)local_2e0);
  }
  else {
    local_3e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((int)uVar5 < 1) {
      bVar4 = false;
      collapse = extraout_DL;
    }
    else {
      uVar10 = 0;
      bVar4 = false;
      do {
        iVar6 = strcmp(argv_00[uVar10],"-debug");
        if (iVar6 == 0) {
          bVar4 = true;
          collapse = extraout_DL_00;
        }
        else {
          std::__cxx11::string::string((string *)local_2e0,argv_00[uVar10],(allocator *)&local_408);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3e8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0
                    );
          collapse = extraout_DL_01;
          if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
            operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
            collapse = extraout_DL_02;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_2e0,(SystemTools *)0x1,(bool)collapse);
    if (0x20 < (ulong)((long)local_3e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_3e8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      uVar10 = 1;
      uVar11 = 2;
      do {
        pcVar2 = local_3e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_408,pcVar2,
                   pcVar2 + local_3e8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length);
        lVar7 = std::__cxx11::string::find((char *)&local_408,0x4c54d5,0);
        if (lVar7 == 0) {
          std::__cxx11::string::substr((ulong)local_3c8,(ulong)&local_408);
          std::__cxx11::string::operator=((string *)local_2e0,(string *)local_3c8);
          if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
            operator_delete((void *)local_3c8._0_8_,
                            (ulong)((long)&(((string *)local_3c8._16_8_)->_M_dataplus)._M_p + 1));
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        bVar3 = uVar11 < (ulong)((long)local_3e8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_3e8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar10 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar3);
    }
    cmSystemTools::s_DisableRunCommandOutput = true;
    if (bVar4) {
      cmCursesForm::DebugStart();
    }
    initscr();
    noecho();
    cbreak();
    keypad(_stdscr,1);
    signal(0x1c,onsig);
    initWidth = 0xffffffff;
    uVar5 = 0xffffffff;
    if (_stdscr != 0) {
      uVar5 = (int)*(short *)(_stdscr + 4) + 1;
      initWidth = (int)*(short *)(_stdscr + 6) + 1;
    }
    if (((int)initWidth < 0x41) || ((int)uVar5 < 6)) {
      endwin();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Window is too small. A size of at least ",0x28);
      poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,0x41);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," x ",3);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," is required to run ccmake.",0x1b);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      uVar5 = 1;
      std::ostream::flush();
    }
    else {
      this = (cmCursesMainForm *)operator_new(0x110);
      cmCursesMainForm::cmCursesMainForm(this,&local_3e8,initWidth);
      iVar6 = cmCursesMainForm::LoadCache(this,(char *)local_2e0._0_8_);
      if (iVar6 == 0) {
        cmSystemTools::SetMessageCallback(CMakeMessageHandler,this);
        cmCursesForm::CurrentForm = (cmCursesForm *)this;
        cmCursesMainForm::InitializeUI(this);
        iVar6 = cmCursesMainForm::Configure(this,1);
        if (iVar6 == 0) {
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                    (this,1,1,(ulong)initWidth,(ulong)uVar5);
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[2])(this);
        }
        erase();
        clearok(_stdscr,1);
        if (_stdscr == 0) {
          iVar6 = -1;
        }
        else {
          iVar6 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar6,1);
        endwin();
        if (cmCursesForm::CurrentForm != (cmCursesForm *)0x0) {
          (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[1])();
        }
        cmCursesForm::CurrentForm = (cmCursesForm *)0x0;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
        std::ostream::put('P');
        plVar9 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        uVar5 = 0;
        std::ostream::flush();
      }
      else {
        erase();
        clearok(_stdscr,1);
        if (_stdscr == 0) {
          iVar6 = -1;
        }
        else {
          iVar6 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar6,1);
        endwin();
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[1])(this);
        uVar5 = 1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error running cmake::LoadCache().  Aborting.\n",0x2d);
      }
    }
    if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
      operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3e8);
  }
  cmDocumentation::~cmDocumentation(&local_388);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_3a0);
  return uVar5;
}

Assistant:

int main(int argc, char const* const* argv)
{
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::FindCMakeResources(argv[0]);
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if(doc.CheckOptions(argc, argv))
    {
    cmake hcm;
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();
    std::vector<cmDocumentationEntry> generators;
    hcm.GetGeneratorDocumentation(generators);
    doc.SetName("ccmake");
    doc.SetSection("Name",cmDocumentationName);
    doc.SetSection("Usage",cmDocumentationUsage);
    if ( argc == 1 )
      {
      doc.AppendSection("Usage",cmDocumentationUsageNote);
      }
    doc.SetSection("Generators",generators);
    doc.PrependSection("Options",cmDocumentationOptions);
    return doc.PrintRequestedDocumentation(std::cout)? 0:1;
    }

  bool debug = false;
  unsigned int i;
  int j;
  std::vector<std::string> args;
  for(j =0; j < argc; ++j)
    {
    if(strcmp(argv[j], "-debug") == 0)
      {
      debug = true;
      }
    else
      {
      args.push_back(argv[j]);
      }
    }

  std::string cacheDir = cmSystemTools::GetCurrentWorkingDirectory();
  for(i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-B",0) == 0)
      {
      cacheDir = arg.substr(2);
      }
    }

  cmSystemTools::DisableRunCommandOutput();

  if (debug)
    {
    cmCursesForm::DebugStart();
    }

  initscr(); /* Initialization */
  noecho(); /* Echo off */
  cbreak(); /* nl- or cr not needed */
  keypad(stdscr,TRUE); /* Use key symbols as
                          KEY_DOWN*/

  signal(SIGWINCH, onsig);

  int x,y;
  getmaxyx(stdscr, y, x);
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    endwin();
    std::cerr << "Window is too small. A size of at least "
              << cmCursesMainForm::MIN_WIDTH << " x "
              <<  cmCursesMainForm::MIN_HEIGHT
              << " is required to run ccmake." <<  std::endl;
    return 1;
    }


  cmCursesMainForm* myform;

  myform = new cmCursesMainForm(args, x);
  if(myform->LoadCache(cacheDir.c_str()))
    {
    curses_clear();
    touchwin(stdscr);
    endwin();
    delete myform;
    std::cerr << "Error running cmake::LoadCache().  Aborting.\n";
    return 1;
    }

  cmSystemTools::SetMessageCallback(CMakeMessageHandler, myform);

  cmCursesForm::CurrentForm = myform;

  myform->InitializeUI();
  if ( myform->Configure(1) == 0 )
    {
    myform->Render(1, 1, x, y);
    myform->HandleInput();
    }

  // Need to clean-up better
  curses_clear();
  touchwin(stdscr);
  endwin();
  delete cmCursesForm::CurrentForm;
  cmCursesForm::CurrentForm = 0;

  std::cout << std::endl << std::endl;

  return 0;

}